

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O0

void button_mask_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Am_Value *pAVar9;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 uVar10;
  undefined4 uVar11;
  Am_Image_Array local_68;
  Am_Style local_60 [3];
  Am_Widget_Look local_44;
  Am_Widget_Look look;
  Am_Font font;
  bool fringe;
  bool is_default;
  bool key_selected;
  int height;
  int width;
  int top;
  int left;
  int y_offset_local;
  int x_offset_local;
  Am_Drawonable *drawonable_local;
  Am_Object *self_local;
  
  uVar11 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  pAVar9 = Am_Object::Get(self,100,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar9);
  uVar5 = iVar4 + x_offset;
  pAVar9 = Am_Object::Get(self,0x65,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar9);
  uVar6 = iVar4 + y_offset;
  pAVar9 = Am_Object::Get(self,0x66,0);
  uVar7 = Am_Value::operator_cast_to_int(pAVar9);
  pAVar9 = Am_Object::Get(self,0x67,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar9);
  pAVar9 = Am_Object::Get(self,0x17c,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar9);
  pAVar9 = Am_Object::Get(self,0x180,0);
  bVar2 = Am_Value::operator_cast_to_bool(pAVar9);
  pAVar9 = Am_Object::Get(self,0x1c7,0);
  bVar3 = Am_Value::operator_cast_to_bool(pAVar9);
  pAVar9 = Am_Object::Get(self,0xac,0);
  Am_Font::Am_Font((Am_Font *)&stack0xffffffffffffffc0,pAVar9);
  pAVar9 = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&local_44,pAVar9);
  if (local_44.value == Am_MOTIF_LOOK_val) {
    if ((!bVar3) || (bVar2)) {
      if ((!bVar3) || ((!bVar2 || (bVar1)))) {
        (*drawonable->_vptr_Am_Drawonable[0x2c])
                  (drawonable,&Am_No_Style,&Am_On_Bits,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,
                   CONCAT44(uVar11,iVar4),0);
      }
      else {
        (*drawonable->_vptr_Am_Drawonable[0x2c])
                  (drawonable,&Am_No_Style,&Am_On_Bits,(ulong)(uVar5 + 2),(ulong)(uVar6 + 2),
                   (ulong)(uVar7 - 4),CONCAT44(uVar11,iVar4 + -4),0);
      }
    }
    else {
      if (bVar1) {
        uVar10 = CONCAT44(uVar11,iVar4);
        (*drawonable->_vptr_Am_Drawonable[0x2c])
                  (drawonable,&Am_Key_Border_Line,&Am_No_Style,(ulong)uVar5,(ulong)uVar6,
                   (ulong)uVar7,uVar10,7);
        uVar11 = (undefined4)((ulong)uVar10 >> 0x20);
      }
      (*drawonable->_vptr_Am_Drawonable[0x2c])
                (drawonable,&Am_No_Style,&Am_On_Bits,(ulong)(uVar5 + 7),(ulong)(uVar6 + 7),
                 (ulong)(uVar7 - 0xe),CONCAT44(uVar11,iVar4 + -0xe),0);
    }
  }
  else if (local_44.value == Am_WINDOWS_LOOK_val) {
    (*drawonable->_vptr_Am_Drawonable[0x2c])
              (drawonable,&Am_No_Style,&Am_On_Bits,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,
               CONCAT44(uVar11,iVar4),0);
  }
  else {
    if (local_44.value != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    if ((bVar3) || (bVar2)) {
      if (bVar2) {
        if ((button_mask_proc(Am_Object,Am_Drawonable*,int,int)::thick == '\0') &&
           (iVar8 = __cxa_guard_acquire(&button_mask_proc(Am_Object,Am_Drawonable*,int,int)::thick),
           iVar8 != 0)) {
          Am_Image_Array::Am_Image_Array(&local_68,&Am_No_Image);
          uVar11 = 0;
          Am_Style::Am_Style(local_60,"black",3,Am_CAP_BUTT,Am_JOIN_MITER,Am_LINE_SOLID,"\x04\x04",2
                             ,Am_FILL_SOLID,Am_FILL_POLY_EVEN_ODD,&local_68);
          Am_Style::Clone_With_New_Color(&button_mask_proc::thick,local_60);
          Am_Style::~Am_Style(local_60);
          Am_Image_Array::~Am_Image_Array(&local_68);
          __cxa_atexit(Am_Style::~Am_Style,&button_mask_proc::thick,&__dso_handle);
          __cxa_guard_release(&button_mask_proc(Am_Object,Am_Drawonable*,int,int)::thick);
        }
        uVar10 = CONCAT44(uVar11,iVar4);
        (*drawonable->_vptr_Am_Drawonable[0x2d])
                  (drawonable,&button_mask_proc::thick,&Am_No_Style,(ulong)uVar5,(ulong)uVar6,
                   (ulong)uVar7,uVar10,8,8,0);
        uVar11 = (undefined4)((ulong)uVar10 >> 0x20);
      }
      (*drawonable->_vptr_Am_Drawonable[0x2d])
                (drawonable,&Am_On_Bits,&Am_On_Bits,(ulong)(uVar5 + 4),(ulong)(uVar6 + 4),
                 (ulong)(uVar7 - 8),CONCAT44(uVar11,iVar4 + -8),5,5,0);
    }
    else {
      (*drawonable->_vptr_Am_Drawonable[0x2d])
                (drawonable,&Am_On_Bits,&Am_On_Bits,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,
                 CONCAT44(uVar11,iVar4),5,5,0);
    }
  }
  Am_Font::~Am_Font((Am_Font *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, button_mask,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);

  bool key_selected = self.Get(Am_KEY_SELECTED);
  bool is_default = self.Get(Am_DEFAULT);
  bool fringe = self.Get(Am_LEAVE_ROOM_FOR_FRINGE);

  Am_Font font(self.Get(Am_FONT));

  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    if (fringe && !is_default) {
      if (key_selected)
        drawonable->Draw_Rectangle(Am_Key_Border_Line, Am_No_Style, left, top,
                                   width, height, Am_DRAW_MASK_COPY);
      drawonable->Draw_Rectangle(Am_No_Style, Am_On_Bits,
                                 left + kMotDefault + kMotKeySel,
                                 top + kMotDefault + kMotKeySel,
                                 width - 2 * (kMotDefault + kMotKeySel),
                                 height - 2 * (kMotDefault + kMotKeySel));
    } else if (fringe && is_default && !key_selected)
      drawonable->Draw_Rectangle(Am_No_Style, Am_On_Bits, left + kMotKeySel,
                                 top + kMotKeySel, width - 2 * kMotKeySel,
                                 height - 2 * kMotKeySel);
    else
      drawonable->Draw_Rectangle(Am_No_Style, Am_On_Bits, left, top, width,
                                 height);
    break;

  case Am_WINDOWS_LOOK_val:
    drawonable->Draw_Rectangle(Am_No_Style, Am_On_Bits, left, top, width,
                               height);
    break;

  case Am_MACINTOSH_LOOK_val:
    if (fringe || is_default) {
      if (is_default) {
        static Am_Style thick =
            Am_Style("black", 3).Clone_With_New_Color(Am_On_Bits);
        drawonable->Draw_Roundtangle(thick, Am_No_Style, left, top, width,
                                     height, 8, 8);
      }
      drawonable->Draw_Roundtangle(Am_On_Bits, Am_On_Bits, left + kMacDefault,
                                   top + kMacDefault, width - 2 * kMacDefault,
                                   height - 2 * kMacDefault, 5, 5);
    } else
      drawonable->Draw_Roundtangle(Am_On_Bits, Am_On_Bits, left, top, width,
                                   height, 5, 5);
    break;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
}